

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQChar * sq_getfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)

{
  SQObjectType SVar1;
  SQFunctionProto *pSVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *in_RDX;
  SQNativeClosure *clo_1;
  SQOuterVar *ov;
  SQFunctionProto *fp;
  SQClosure *clo;
  SQChar *name;
  SQObjectPtr *self;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _HashNode **local_28;
  
  pSVar3 = stack_get((HSQUIRRELVM)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (SQInteger)in_stack_ffffffffffffffa8);
  local_28 = (_HashNode **)0x0;
  SVar1 = (pSVar3->super_SQObject)._type;
  if (SVar1 == OT_CLOSURE) {
    pSVar2 = ((pSVar3->super_SQObject)._unVal.pClosure)->_function;
    if (in_RDX < (SQObjectPtr *)pSVar2->_noutervalues) {
      SQVM::Push((SQVM *)CONCAT44(0x8000100,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
      local_28 = &(pSVar2->_outervalues[(long)in_RDX]._name.super_SQObject._unVal.pTable)->
                  _firstfree;
    }
  }
  else if ((SVar1 == OT_NATIVECLOSURE) &&
          (in_RDX < ((pSVar3->super_SQObject)._unVal.pClosure)->_defaultparams)) {
    SQVM::Push((SQVM *)CONCAT44(0x8000200,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
    local_28 = (_HashNode **)0x14e3d0;
  }
  return (SQChar *)local_28;
}

Assistant:

const SQChar *sq_getfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)
{
    SQObjectPtr &self=stack_get(v,idx);
    const SQChar *name = NULL;
    switch(sq_type(self))
    {
    case OT_CLOSURE:{
        SQClosure *clo = _closure(self);
        SQFunctionProto *fp = clo->_function;
        if(((SQUnsignedInteger)fp->_noutervalues) > nval) {
            v->Push(*(_outer(clo->_outervalues[nval])->_valptr));
            SQOuterVar &ov = fp->_outervalues[nval];
            name = _stringval(ov._name);
        }
                    }
        break;
    case OT_NATIVECLOSURE:{
        SQNativeClosure *clo = _nativeclosure(self);
        if(clo->_noutervalues > nval) {
            v->Push(clo->_outervalues[nval]);
            name = _SC("@NATIVE");
        }
                          }
        break;
    default: break; //shutup compiler
    }
    return name;
}